

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vta_ManSatVerify(Vta_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Vta_Obj_t *pVVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *pThis1;
  
  iVar7 = 1;
  while ((iVar7 < p->nObjs && (pVVar4 = Vta_ManObj(p,iVar7), pVVar4 != (Vta_Obj_t *)0x0))) {
    iVar2 = sat_solver2_var_value(p->pSat,iVar7);
    *(uint *)&pVVar4->field_0xc =
         (*(uint *)&pVVar4->field_0xc & 0xcfffffff) + (uint)(iVar2 != 0) * 0x10000000 + 0x10000000;
    iVar7 = iVar7 + 1;
  }
  iVar7 = 1;
  do {
    if (((p->nObjs <= iVar7) || (pVVar4 = Vta_ManObj(p,iVar7), pVVar4 == (Vta_Obj_t *)0x0)) ||
       (pGVar5 = Gia_ManObj(p->pGia,pVVar4->iObj), pGVar5 == (Gia_Obj_t *)0x0)) {
      return;
    }
    if ((pVVar4->field_0xf & 0x40) != 0) {
      Vta_ObjPreds(p,pVVar4,pGVar5,&pThis0,&pThis1);
      uVar1 = *(ulong *)pGVar5;
      if ((~(uint)uVar1 & 0x1fffffff) == 0 || (int)(uint)uVar1 < 0) {
        iVar2 = Gia_ObjIsRo(p->pGia,pGVar5);
        if (iVar2 != 0) {
          pGVar5 = Gia_ObjRoToRi(p->pGia,pGVar5);
          if (pVVar4->iFrame == 0) {
            if ((*(uint *)&pVVar4->field_0xc & 0x30000000) != 0x10000000) {
              __assert_fail("pThis->Value == VTA_VAR0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                            ,0x218,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
          else {
            uVar6 = *(uint *)&pVVar4->field_0xc >> 0x1c & 3;
            if (uVar6 == 2) {
              iVar2 = Vta_ValIs1(pThis0,*(uint *)pGVar5 >> 0x1d & 1);
              if (iVar2 == 0) {
                __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x21c,"void Vta_ManSatVerify(Vta_Man_t *)");
              }
            }
            else {
              if (uVar6 != 1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x21d,"void Vta_ManSatVerify(Vta_Man_t *)");
              }
              iVar2 = Vta_ValIs0(pThis0,*(uint *)pGVar5 >> 0x1d & 1);
              if (iVar2 == 0) {
                __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                              ,0x21a,"void Vta_ManSatVerify(Vta_Man_t *)");
              }
            }
          }
        }
      }
      else {
        uVar3 = *(uint *)&pVVar4->field_0xc >> 0x1c & 3;
        uVar6 = (uint)(uVar1 >> 0x20);
        if (uVar3 == 1) {
          iVar2 = Vta_ValIs0(pThis0,(uint)(uVar1 >> 0x1d) & 1);
          if ((iVar2 == 0) && (iVar2 = Vta_ValIs0(pThis1,uVar6 >> 0x1d & 1), iVar2 == 0)) {
            __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x211,"void Vta_ManSatVerify(Vta_Man_t *)");
          }
        }
        else {
          if (uVar3 != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x212,"void Vta_ManSatVerify(Vta_Man_t *)");
          }
          iVar2 = Vta_ValIs1(pThis0,(uint)(uVar1 >> 0x1d) & 1);
          if ((iVar2 == 0) || (iVar2 = Vta_ValIs1(pThis1,uVar6 >> 0x1d & 1), iVar2 == 0)) {
            __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                          ,0x20f,"void Vta_ManSatVerify(Vta_Man_t *)");
          }
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

void Vta_ManSatVerify( Vta_Man_t * p )
{
    Vta_Obj_t * pThis, * pThis0, * pThis1;
    Gia_Obj_t * pObj;
    int i;
    Vta_ManForEachObj( p, pThis, i )
        pThis->Value = (sat_solver2_var_value(p->pSat, i) ? VTA_VAR1 : VTA_VAR0);
    Vta_ManForEachObjObj( p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }
}